

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolynomialNormalizer.hpp
# Opt level: O0

void __thiscall
Kernel::PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_>::PreMonom
          (PreMonom<Kernel::NumTraits<Kernel::RationalConstantType>_> *this,Numeral *n,
          initializer_list<Kernel::PolyNf> factors)

{
  Stack<Kernel::PolyNf> *this_00;
  EVP_PKEY_CTX *in_RDX;
  RationalConstantType *in_RDI;
  RationalConstantType *in_stack_ffffffffffffffb0;
  
  RationalConstantType::RationalConstantType(in_stack_ffffffffffffffb0,in_RDI);
  Lib::Recycled<Lib::Stack<Kernel::PolyNf>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::Recycled
            ((Recycled<Lib::Stack<Kernel::PolyNf>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> *)
             in_RDI);
  this_00 = Lib::Recycled<Lib::Stack<Kernel::PolyNf>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
            operator->((Recycled<Lib::Stack<Kernel::PolyNf>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                        *)0x927652);
  Lib::Stack<Kernel::PolyNf>::init(this_00,in_RDX);
  return;
}

Assistant:

PreMonom(Numeral n, std::initializer_list<PolyNf> factors) : numeral(std::move(n)), factors() 
  { this->factors->init(factors); }